

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O0

void init_opt_struct(void)

{
  nh_option_desc *pnVar1;
  
  options = clone_optlist(const_options);
  birth_options = clone_optlist(const_birth_options);
  build_role_spec();
  build_race_spec();
  pnVar1 = find_option(options,"disclose");
  (pnVar1->field_4).e.choices = disclose_list;
  *(undefined8 *)((long)&pnVar1->field_4 + 8) = 4;
  pnVar1 = find_option(options,"fruit");
  (pnVar1->field_4).i.max = 0x20;
  pnVar1 = find_option(options,"hp_notify_format");
  (pnVar1->field_4).i.max = 0x50;
  pnVar1 = find_option(options,"menumatch");
  (pnVar1->field_4).e.choices = menumatch_list;
  *(undefined8 *)((long)&pnVar1->field_4 + 8) = 2;
  pnVar1 = find_option(options,"menustyle");
  (pnVar1->field_4).e.choices = menustyle_list;
  *(undefined8 *)((long)&pnVar1->field_4 + 8) = 2;
  pnVar1 = find_option(options,"pickup_burden");
  (pnVar1->field_4).e.choices = pickup_burden_list;
  *(undefined8 *)((long)&pnVar1->field_4 + 8) = 6;
  pnVar1 = find_option(options,"packorder");
  (pnVar1->field_4).i.max = 0x12;
  pnVar1 = find_option(options,"pilesize");
  (pnVar1->field_4).i.min = 1;
  pnVar1 = find_option(options,"pilesize");
  (pnVar1->field_4).i.max = 0x14;
  pnVar1 = find_option(options,"runmode");
  (pnVar1->field_4).e.choices = runmode_list;
  *(undefined8 *)((long)&pnVar1->field_4 + 8) = 4;
  pnVar1 = find_option(options,"safe_peaceful");
  (pnVar1->field_4).e.choices = safe_peaceful_list;
  *(undefined8 *)((long)&pnVar1->field_4 + 8) = 3;
  pnVar1 = find_option(options,"sparkle");
  (pnVar1->field_4).i.min = 0;
  pnVar1 = find_option(options,"sparkle");
  (pnVar1->field_4).i.max = 0x15;
  pnVar1 = find_option(options,"spellorder");
  (pnVar1->field_4).i.max = 0x4e;
  pnVar1 = find_option(options,"autopickup_rules");
  (pnVar1->field_4).e.choices = ap_object_class_list;
  *(undefined8 *)((long)&pnVar1->field_4 + 8) = 0x10;
  pnVar1 = find_option(birth_options,"align");
  (pnVar1->field_4).e.choices = align_list;
  *(undefined8 *)((long)&pnVar1->field_4 + 8) = 5;
  pnVar1 = find_option(birth_options,"gender");
  (pnVar1->field_4).e.choices = gender_list;
  *(undefined8 *)((long)&pnVar1->field_4 + 8) = 4;
  pnVar1 = find_option(birth_options,"role");
  (pnVar1->field_4).e.choices = role_spec.choices;
  *(undefined8 *)((long)&pnVar1->field_4 + 8) = role_spec._8_8_;
  pnVar1 = find_option(birth_options,"race");
  (pnVar1->field_4).e.choices = race_spec.choices;
  *(undefined8 *)((long)&pnVar1->field_4 + 8) = race_spec._8_8_;
  pnVar1 = find_option(birth_options,"pettype");
  (pnVar1->field_4).e.choices = pettype_list;
  *(undefined8 *)((long)&pnVar1->field_4 + 8) = 6;
  pnVar1 = find_option(birth_options,"catname");
  (pnVar1->field_4).i.max = 0x3f;
  pnVar1 = find_option(birth_options,"dogname");
  (pnVar1->field_4).i.max = 0x3f;
  pnVar1 = find_option(birth_options,"horsename");
  (pnVar1->field_4).i.max = 0x3f;
  pnVar1 = find_option(birth_options,"crocname");
  (pnVar1->field_4).i.max = 0x3f;
  pnVar1 = find_option(birth_options,"monkeyname");
  (pnVar1->field_4).i.max = 0x3f;
  pnVar1 = find_option(birth_options,"wolfname");
  (pnVar1->field_4).i.max = 0x3f;
  pnVar1 = find_option(birth_options,"ratname");
  (pnVar1->field_4).i.max = 0x3f;
  flags.init_role = -1;
  flags.init_race = -1;
  flags.init_gend = -1;
  flags.init_align = -1;
  return;
}

Assistant:

void init_opt_struct(void)
{
	options = clone_optlist(const_options);
	birth_options = clone_optlist(const_birth_options);
	
	build_role_spec();
	build_race_spec();
	
	/* initialize option definitions */
	find_option(options, "disclose")->e = disclose_spec;
	find_option(options, "fruit")->s.maxlen = PL_FSIZ;
	find_option(options, "hp_notify_format")->s.maxlen = 80; /* min term width */
	find_option(options, "menumatch")->e = menumatch_spec;
	find_option(options, "menustyle")->e = menustyle_spec;
	find_option(options, "pickup_burden")->e = pickup_burden_spec;
	find_option(options, "packorder")->s.maxlen = MAXOCLASSES;
	find_option(options, "pilesize")->i.min = 1;
	find_option(options, "pilesize")->i.max = 20;
	find_option(options, "runmode")->e = runmode_spec;
	find_option(options, "safe_peaceful")->e = safe_peaceful_spec;
	find_option(options, "sparkle")->i.min = 0;
	find_option(options, "sparkle")->i.max = 21; /* SHIELD_COUNT in display.h */
	find_option(options, "spellorder")->s.maxlen = 78; /* "a-bc-d...Y-Z" */
	find_option(options, "autopickup_rules")->a = autopickup_spec;
	
	find_option(birth_options, "align")->e = align_spec;
	find_option(birth_options, "gender")->e = gender_spec;
	find_option(birth_options, "role")->e = role_spec;
	find_option(birth_options, "race")->e = race_spec;
	find_option(birth_options, "pettype")->e = pettype_spec;
	find_option(birth_options, "catname")->s.maxlen = PL_PSIZ;
	find_option(birth_options, "dogname")->s.maxlen = PL_PSIZ;
	find_option(birth_options, "horsename")->s.maxlen = PL_PSIZ;
	find_option(birth_options, "crocname")->s.maxlen = PL_PSIZ;
	find_option(birth_options, "monkeyname")->s.maxlen = PL_PSIZ;
	find_option(birth_options, "wolfname")->s.maxlen = PL_PSIZ;
	find_option(birth_options, "ratname")->s.maxlen = PL_PSIZ;

	/* If no config file exists, these values will not get set until they
	 * have already been used during game startup.  (-1) is a much better
	 * default, as 0 will always cause a lawful male Archologist to be created */
	flags.init_align = flags.init_gend = flags.init_race = flags.init_role = -1;
}